

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O0

size_t helics::detail::convertToBinary
                 (byte *data,
                 vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val)

{
  bool bVar1;
  void *__dest;
  complex<double> *__src;
  size_type sVar2;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_RSI;
  long in_RDI;
  undefined8 in_stack_ffffffffffffffd8;
  byte code;
  byte *in_stack_ffffffffffffffe0;
  
  code = (byte)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
  CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size(in_RSI);
  addCodeAndSize(in_stack_ffffffffffffffe0,code,0x381484);
  bVar1 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::empty
                    ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)in_RSI)
  ;
  if (!bVar1) {
    __dest = (void *)(in_RDI + 8);
    __src = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::data
                      ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                       0x3814a9);
    sVar2 = CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                      (in_RSI);
    memcpy(__dest,__src,sVar2 << 4);
  }
  sVar2 = CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                    (in_RSI);
  return sVar2 * 0x10 + 8;
}

Assistant:

size_t convertToBinary(std::byte* data, const std::vector<std::complex<double>>& val)
{
    addCodeAndSize(data, cvCode, val.size());
    if (!val.empty()) {
        std::memcpy(data + 8, val.data(), val.size() * sizeof(double) * 2);
    }
    return val.size() * sizeof(double) * 2U + 8U;
}